

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddWalsh.c
# Opt level: O1

DdNode * Cudd_addResidue(DdManager *dd,int n,int m,int options,int top)

{
  int *piVar1;
  void *pvVar2;
  int index;
  byte bVar3;
  void *pvVar4;
  void *pvVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  DdNode **array [2];
  void *local_88 [2];
  ulong local_78;
  int local_70;
  uint local_6c;
  void *local_68;
  int local_60;
  int local_5c;
  void *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (0 < n || 1 < m) {
    local_6c = options;
    pvVar4 = malloc((long)m << 3);
    if (pvVar4 != (void *)0x0) {
      local_88[0] = pvVar4;
      local_48 = (ulong)(uint)top;
      pvVar5 = malloc((long)m << 3);
      local_88[1] = pvVar5;
      if (pvVar5 != (void *)0x0) {
        uVar13 = (ulong)(uint)m;
        local_78 = (ulong)(uint)n;
        if (0 < m) {
          memset(pvVar5,0,uVar13 * 8);
          memset(pvVar4,0,uVar13 * 8);
          uVar9 = 0;
          do {
            pDVar6 = cuddUniqueConst(dd,(double)(int)uVar9);
            if (pDVar6 == (DdNode *)0x0) {
              if (uVar9 != 0) {
                uVar13 = 0;
                do {
                  Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + uVar13 * 8));
                  uVar13 = uVar13 + 1;
                } while (uVar9 != uVar13);
              }
              goto LAB_0076b3a6;
            }
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            *(DdNode **)((long)pvVar5 + uVar9 * 8) = pDVar6;
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        uVar11 = (uint)local_78;
        if (0 < (int)uVar11) {
          local_5c = (int)local_48 + uVar11;
          local_60 = uVar11 - 1;
          iVar8 = 1;
          uVar9 = 0;
          bVar3 = (byte)local_6c;
          local_68 = pvVar4;
          local_58 = pvVar5;
          do {
            pvVar5 = local_58;
            uVar11 = (uint)uVar9;
            uVar10 = (ulong)(uVar11 & 1 ^ 1);
            index = uVar11 + (int)local_48;
            if ((local_6c & 1) != 0) {
              index = ~uVar11 + local_5c;
            }
            local_70 = iVar8;
            local_38 = uVar9;
            pDVar6 = cuddUniqueInter(dd,index,dd->one,dd->zero);
            iVar8 = local_70;
            if (pDVar6 == (DdNode *)0x0) {
              pvVar4 = local_68;
              if (0 < m) {
                pvVar2 = local_88[uVar10];
                uVar9 = 0;
                do {
                  Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + uVar9 * 8));
                  uVar9 = uVar9 + 1;
                  pvVar4 = local_68;
                } while (uVar13 != uVar9);
              }
LAB_0076b3a6:
              free(pvVar4);
LAB_0076b3b6:
              local_88[0] = (void *)0x0;
              free(pvVar5);
              return (DdNode *)0x0;
            }
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            local_50 = uVar10;
            if (0 < m) {
              pvVar4 = local_88[uVar10];
              local_40 = (ulong)(uVar11 & 1);
              uVar9 = 0;
              do {
                pDVar7 = Cudd_addIte(dd,pDVar6,
                                     *(DdNode **)
                                      ((long)pvVar4 + (long)(((int)uVar9 + iVar8) % m) * 8),
                                     *(DdNode **)((long)pvVar4 + uVar9 * 8));
                if (pDVar7 == (DdNode *)0x0) {
                  if (uVar9 != 0) {
                    pvVar5 = local_88[local_40];
                    uVar13 = 0;
                    do {
                      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + uVar13 * 8));
                      uVar13 = uVar13 + 1;
                    } while (uVar9 != uVar13);
                  }
                  pvVar5 = local_68;
                  uVar13 = 1;
                  if (1 < m) {
                    uVar13 = (ulong)(uint)m;
                  }
                  uVar9 = 0;
                  do {
                    Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + uVar9 * 8));
                    uVar9 = uVar9 + 1;
                  } while (uVar13 != uVar9);
                  free(pvVar5);
                  pvVar5 = local_58;
                  goto LAB_0076b3b6;
                }
                piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                *(DdNode **)((long)local_88[local_40] + uVar9 * 8) = pDVar7;
                uVar9 = uVar9 + 1;
              } while (uVar13 != uVar9);
            }
            if (0 < m) {
              pvVar4 = local_88[local_50];
              uVar9 = 0;
              do {
                Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + uVar9 * 8));
                uVar9 = uVar9 + 1;
              } while (uVar13 != uVar9);
            }
            Cudd_RecursiveDeref(dd,pDVar6);
            iVar8 = (local_70 * 2) % m;
            if (((int)local_38 == local_60 & bVar3 >> 1) == 1) {
              iVar8 = (m - iVar8) % m;
            }
            uVar12 = (int)local_38 + 1;
            uVar9 = (ulong)uVar12;
            uVar11 = (uint)local_78;
            pvVar4 = local_68;
            pvVar5 = local_58;
          } while (uVar12 != uVar11);
        }
        local_78 = (ulong)~uVar11;
        if (1 < m) {
          pvVar2 = local_88[~uVar11 & 1];
          uVar9 = 1;
          do {
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + uVar9 * 8));
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        pDVar6 = *local_88[(uint)local_78 & 1];
        free(pvVar4);
        local_88[0] = (void *)0x0;
        free(pvVar5);
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar6;
      }
      free(pvVar4);
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addResidue(
  DdManager * dd /* manager */,
  int  n /* number of bits */,
  int  m /* modulus */,
  int  options /* options */,
  int  top /* index of top variable */)
{
    int msbLsb; /* MSB on top (1) or LSB on top (0) */
    int tc;     /* two's complement (1) or unsigned (0) */
    int i, j, k, t, residue, thisOne, previous, index;
    DdNode **array[2], *var, *tmp, *res;

    /* Sanity check. */
    if (n < 1 && m < 2) return(NULL);

    msbLsb = options & CUDD_RESIDUE_MSB;
    tc = options & CUDD_RESIDUE_TC;

    /* Allocate and initialize working arrays. */
    array[0] = ABC_ALLOC(DdNode *,m);
    if (array[0] == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    array[1] = ABC_ALLOC(DdNode *,m);
    if (array[1] == NULL) {
        ABC_FREE(array[0]);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < m; i++) {
        array[0][i] = array[1][i] = NULL;
    }

    /* Initialize residues. */
    for (i = 0; i < m; i++) {
        tmp = cuddUniqueConst(dd,(CUDD_VALUE_TYPE) i);
        if (tmp == NULL) {
            for (j = 0; j < i; j++) {
                Cudd_RecursiveDeref(dd,array[1][j]);
            }
            ABC_FREE(array[0]);
            ABC_FREE(array[1]);
            return(NULL);
        }
        cuddRef(tmp);
        array[1][i] = tmp;
    }

    /* Main iteration. */
    residue = 1;        /* residue of 2**0 */
    for (k = 0; k < n; k++) {
        /* Choose current and previous arrays. */
        thisOne = k & 1;
        previous = thisOne ^ 1;
        /* Build an ADD projection function. */
        if (msbLsb) {
            index = top+n-k-1;
        } else {
            index = top+k;
        }
        var = cuddUniqueInter(dd,index,DD_ONE(dd),DD_ZERO(dd));
        if (var == NULL) {
            for (j = 0; j < m; j++) {
                Cudd_RecursiveDeref(dd,array[previous][j]);
            }
            ABC_FREE(array[0]);
            ABC_FREE(array[1]);
            return(NULL);
        }
        cuddRef(var);
        for (i = 0; i < m; i ++) {
            t = (i + residue) % m;
            tmp = Cudd_addIte(dd,var,array[previous][t],array[previous][i]);
            if (tmp == NULL) {
                for (j = 0; j < i; j++) {
                    Cudd_RecursiveDeref(dd,array[thisOne][j]);
                }
                for (j = 0; j < m; j++) {
                    Cudd_RecursiveDeref(dd,array[previous][j]);
                }
                ABC_FREE(array[0]);
                ABC_FREE(array[1]);
                return(NULL);
            }
            cuddRef(tmp);
            array[thisOne][i] = tmp;
        }
        /* One layer completed. Free the other array for the next iteration. */
        for (i = 0; i < m; i++) {
            Cudd_RecursiveDeref(dd,array[previous][i]);
        }
        Cudd_RecursiveDeref(dd,var);
        /* Update residue of 2**k. */
        residue = (2 * residue) % m;
        /* Adjust residue for MSB, if this is a two's complement number. */
        if (tc && (k == n - 1)) {
            residue = (m - residue) % m;
        }
    }

    /* We are only interested in the 0-residue node of the top layer. */
    for (i = 1; i < m; i++) {
        Cudd_RecursiveDeref(dd,array[(n - 1) & 1][i]);
    }
    res = array[(n - 1) & 1][0];

    ABC_FREE(array[0]);
    ABC_FREE(array[1]);

    cuddDeref(res);
    return(res);

}